

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall arealights::Application::loadShaders(Application *this)

{
  string *psVar1;
  undefined8 uVar2;
  allocator<char> local_5a;
  allocator<char> local_59;
  undefined1 local_58 [40];
  string local_30;
  
  psVar1 = (string *)
           (this->_renderHelper).
           super___shared_ptr<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"../assets/TextureBlitToSRGB.vs.glsl",&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_58 + 8),"../assets/TextureBlitToSRGB.fs.glsl",&local_5a);
  RenderHelper::makeSimpleShader((RenderHelper *)local_58,psVar1,&local_30);
  uVar2 = local_58._0_8_;
  local_58._0_8_ = (__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>)0x0;
  std::__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::reset
            ((__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)
             &this->_blitSRGBProgram,(pointer)uVar2);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            ((unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_30);
  psVar1 = (string *)
           (this->_renderHelper).
           super___shared_ptr<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"../assets/Clustering.vs.glsl",&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_58 + 8),"../assets/Clustering.fs.glsl",&local_5a);
  RenderHelper::makeSimpleShader((RenderHelper *)local_58,psVar1,&local_30);
  uVar2 = local_58._0_8_;
  local_58._0_8_ = (__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>)0x0;
  std::__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::reset
            ((__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)
             &this->_clusteringShader,(pointer)uVar2);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            ((unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Application::loadShaders()
{
    _blitSRGBProgram = _renderHelper->makeSimpleShader(
        "../assets/TextureBlitToSRGB.vs.glsl",
        "../assets/TextureBlitToSRGB.fs.glsl"
    );

    _clusteringShader = _renderHelper->makeSimpleShader(
        "../assets/Clustering.vs.glsl",
        "../assets/Clustering.fs.glsl"
    );
}